

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

void __thiscall pbrt::Integrator::~Integrator(Integrator *this)

{
  this->_vptr_Integrator = (_func_int **)&PTR__Integrator_03011858;
  std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
            (&(this->infiniteLights).
              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>);
  std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
            (&(this->lights).
              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>);
  return;
}

Assistant:

Integrator::~Integrator() {}